

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_pvrtc1_4.cpp
# Opt level: O2

bool __thiscall
basisu::pvrtc4_image::get_interpolated_colors
          (pvrtc4_image *this,uint32_t x,uint32_t y,color_rgba *pColors)

{
  anon_union_4_2_6eba8969_for_color_rgba_0 *this_00;
  pvrtc4_block_vector2D *this_01;
  byte bVar1;
  byte bVar2;
  anon_union_4_2_6eba8969_for_color_rgba_0 *paVar3;
  anon_union_4_2_6eba8969_for_color_rgba_0 *this_02;
  anon_union_4_2_6eba8969_for_color_rgba_0 *paVar4;
  bool bVar5;
  uint32_t x_00;
  uint32_t uVar6;
  anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1 aVar7;
  pvrtc4_block *ppVar8;
  byte *pbVar9;
  uint8_t *puVar10;
  undefined4 in_register_00000014;
  uint8_t uVar11;
  uint32_t c;
  uint32_t index;
  uint32_t uVar12;
  undefined4 in_register_00000034;
  int x_01;
  int x_02;
  uint x_03;
  uint y_00;
  anon_union_4_2_6eba8969_for_color_rgba_0 local_6c;
  anon_union_4_2_6eba8969_for_color_rgba_0 local_68;
  anon_union_4_2_6eba8969_for_color_rgba_0 local_64;
  uint32_t local_60;
  uint32_t local_5c;
  undefined8 local_58;
  anon_union_4_2_6eba8969_for_color_rgba_0 *local_50;
  anon_union_4_2_6eba8969_for_color_rgba_0 *local_48;
  uint32_t local_3c;
  uint32_t local_38;
  anon_union_4_2_6eba8969_for_color_rgba_0 local_34;
  
  local_58 = CONCAT44(in_register_00000034,x);
  local_50 = (anon_union_4_2_6eba8969_for_color_rgba_0 *)CONCAT44(in_register_00000014,y);
  local_48 = &pColors->field_0;
  if ((x < this->m_width) && (y < this->m_height)) {
    x_01 = (int)(x - 2) >> 2;
    x_02 = (int)(y - 2) >> 2;
    x_00 = posmod(x_01,this->m_block_width);
    local_60 = posmod(x_01 + 1,this->m_block_width);
    uVar6 = posmod(x_02,this->m_block_height);
    local_5c = posmod(x_02 + 1,this->m_block_height);
    this_01 = &this->m_blocks;
    local_3c = x_00;
    local_38 = uVar6;
    ppVar8 = vector2D<basisu::pvrtc4_block>::operator()(this_01,x_00,uVar6);
    index = 0;
    local_64.field_1 =
         (anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1)
         pvrtc4_block::get_endpoint_5554(ppVar8,0);
    uVar12 = local_60;
    ppVar8 = vector2D<basisu::pvrtc4_block>::operator()(this_01,local_60,uVar6);
    local_68.field_1 =
         (anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1)
         pvrtc4_block::get_endpoint_5554(ppVar8,0);
    uVar6 = local_5c;
    ppVar8 = vector2D<basisu::pvrtc4_block>::operator()(this_01,x_00,local_5c);
    local_6c.field_1 =
         (anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1)
         pvrtc4_block::get_endpoint_5554(ppVar8,0);
    ppVar8 = vector2D<basisu::pvrtc4_block>::operator()(this_01,uVar12,uVar6);
    local_34.field_1 =
         (anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1)
         pvrtc4_block::get_endpoint_5554(ppVar8,0);
    aVar7 = (anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1)
            interpolate(this,(int)local_58,(int)local_50,(color_rgba *)&local_64.field_1,
                        (color_rgba *)&local_68.field_1,(color_rgba *)&local_6c.field_1,
                        (color_rgba *)&local_34.field_1);
    uVar6 = local_38;
    paVar3 = local_48;
    local_48->field_1 = aVar7;
    ppVar8 = vector2D<basisu::pvrtc4_block>::operator()(this_01,x_00,local_38);
    local_64.field_1 =
         (anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1)
         pvrtc4_block::get_endpoint_5554(ppVar8,1);
    uVar12 = local_60;
    ppVar8 = vector2D<basisu::pvrtc4_block>::operator()(this_01,local_60,uVar6);
    local_68.field_1 =
         (anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1)
         pvrtc4_block::get_endpoint_5554(ppVar8,1);
    uVar6 = local_5c;
    ppVar8 = vector2D<basisu::pvrtc4_block>::operator()(this_01,local_3c,local_5c);
    local_6c.field_1 =
         (anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1)
         pvrtc4_block::get_endpoint_5554(ppVar8,1);
    ppVar8 = vector2D<basisu::pvrtc4_block>::operator()(this_01,uVar12,uVar6);
    local_34.field_1 =
         (anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1)
         pvrtc4_block::get_endpoint_5554(ppVar8,1);
    x_03 = (uint)local_58;
    y_00 = (uint)local_50;
    aVar7 = (anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1)
            interpolate(this,x_03,y_00,(color_rgba *)&local_64.field_1,
                        (color_rgba *)&local_68.field_1,(color_rgba *)&local_6c.field_1,
                        (color_rgba *)&local_34.field_1);
    this_00 = paVar3 + 3;
    paVar3[3].field_1 = aVar7;
    bVar5 = get_block_uses_transparent_modulation(this,x_03 >> 2,y_00 >> 2);
    this_02 = local_48;
    local_58 = CONCAT71(local_58._1_7_,bVar5);
    paVar4 = paVar3 + 1;
    if (bVar5) {
      for (uVar12 = 0; uVar12 != 4; uVar12 = uVar12 + 1) {
        pbVar9 = color_rgba::operator[]((color_rgba *)&local_48->field_1,uVar12);
        bVar1 = *pbVar9;
        pbVar9 = color_rgba::operator[]((color_rgba *)&this_00->field_1,uVar12);
        bVar2 = *pbVar9;
        puVar10 = color_rgba::operator[]((color_rgba *)&paVar3[1].field_1,uVar12);
        uVar11 = (uint8_t)((uint)bVar2 + (uint)bVar1 >> 1);
        *puVar10 = uVar11;
        puVar10 = color_rgba::operator[]((color_rgba *)&paVar3[2].field_1,uVar12);
        *puVar10 = uVar11;
      }
      *(undefined1 *)((long)local_48 + 0xb) = 0;
    }
    else {
      for (; local_50 = paVar4, index != 4; index = index + 1) {
        pbVar9 = color_rgba::operator[]((color_rgba *)&this_02->field_1,index);
        bVar1 = *pbVar9;
        pbVar9 = color_rgba::operator[]((color_rgba *)&this_00->field_1,index);
        bVar2 = *pbVar9;
        puVar10 = color_rgba::operator[]((color_rgba *)&local_50->field_1,index);
        *puVar10 = (uint8_t)((uint)bVar2 + (uint)bVar2 * 2 + (uint)bVar1 + (uint)bVar1 * 4 >> 3);
        pbVar9 = color_rgba::operator[]((color_rgba *)&this_02->field_1,index);
        bVar1 = *pbVar9;
        pbVar9 = color_rgba::operator[]((color_rgba *)&this_00->field_1,index);
        bVar2 = *pbVar9;
        puVar10 = color_rgba::operator[]((color_rgba *)&paVar3[2].field_1,index);
        *puVar10 = (uint8_t)((uint)bVar2 + (uint)bVar2 * 4 + (uint)bVar1 + (uint)bVar1 * 2 >> 3);
        paVar4 = local_50;
      }
    }
    return (bool)(undefined1)local_58;
  }
  __assert_fail("(x < m_width) && (y < m_height)",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_pvrtc1_4.cpp"
                ,0x12e,
                "bool basisu::pvrtc4_image::get_interpolated_colors(uint32_t, uint32_t, color_rgba *) const"
               );
}

Assistant:

bool pvrtc4_image::get_interpolated_colors(uint32_t x, uint32_t y, color_rgba* pColors) const
	{
		assert((x < m_width) && (y < m_height));

		int block_x0 = (static_cast<int>(x) - 2) >> 2;
		int block_x1 = block_x0 + 1;
		int block_y0 = (static_cast<int>(y) - 2) >> 2;
		int block_y1 = block_y0 + 1;
		
		block_x0 = posmod(block_x0, m_block_width);
		block_x1 = posmod(block_x1, m_block_width);
		block_y0 = posmod(block_y0, m_block_height);
		block_y1 = posmod(block_y1, m_block_height);
		
		pColors[0] = interpolate(x, y, m_blocks(block_x0, block_y0).get_endpoint_5554(0), m_blocks(block_x1, block_y0).get_endpoint_5554(0), m_blocks(block_x0, block_y1).get_endpoint_5554(0), m_blocks(block_x1, block_y1).get_endpoint_5554(0));
		pColors[3] = interpolate(x, y, m_blocks(block_x0, block_y0).get_endpoint_5554(1), m_blocks(block_x1, block_y0).get_endpoint_5554(1), m_blocks(block_x0, block_y1).get_endpoint_5554(1), m_blocks(block_x1, block_y1).get_endpoint_5554(1));

		if (get_block_uses_transparent_modulation(x >> 2, y >> 2))
		{
			for (uint32_t c = 0; c < 4; c++)
			{
				uint32_t m = (pColors[0][c] + pColors[3][c]) / 2;
				pColors[1][c] = static_cast<uint8_t>(m);
				pColors[2][c] = static_cast<uint8_t>(m);
			}
			pColors[2][3] = 0;
			return true;
		}

		for (uint32_t c = 0; c < 4; c++)
		{
			pColors[1][c] = static_cast<uint8_t>((pColors[0][c] * 5 + pColors[3][c] * 3) / 8);
			pColors[2][c] = static_cast<uint8_t>((pColors[0][c] * 3 + pColors[3][c] * 5) / 8);
		}

		return false;
	}